

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# separable_info.c
# Opt level: O0

double * inform_local_separable_info
                   (int *srcs,int *dest,size_t l,size_t n,size_t m,int b,size_t k,double *si,
                   inform_error *err)

{
  _Bool _Var1;
  double *te_00;
  bool bVar2;
  ulong local_68;
  size_t j;
  size_t i;
  double *te;
  size_t N;
  _Bool allocated_si;
  int b_local;
  size_t m_local;
  size_t n_local;
  size_t l_local;
  int *dest_local;
  int *srcs_local;
  
  if (l == 0) {
    if (err != (inform_error *)0x0) {
      *err = INFORM_ENOSOURCES;
    }
    srcs_local = (int *)0x0;
  }
  else {
    bVar2 = si == (double *)0x0;
    srcs_local = (int *)inform_local_active_info(dest,n,m,b,k,si,err);
    _Var1 = inform_failed(err);
    if (_Var1) {
      if (bVar2) {
        free(srcs_local);
      }
      srcs_local = (int *)0x0;
    }
    else {
      te_00 = (double *)malloc(n * (m - k) * 8);
      if (te_00 == (double *)0x0) {
        if (bVar2) {
          free(srcs_local);
        }
        if (err != (inform_error *)0x0) {
          *err = INFORM_ENOMEM;
        }
        srcs_local = (int *)0x0;
      }
      else {
        dest_local = srcs;
        for (j = 0; j < l; j = j + 1) {
          inform_local_transfer_entropy(dest_local,dest,(int *)0x0,0,n,m,b,k,te_00,err);
          _Var1 = inform_failed(err);
          if (_Var1) {
            free(te_00);
            if (bVar2) {
              free(srcs_local);
            }
            return (double *)0x0;
          }
          for (local_68 = 0; local_68 < n * (m - k); local_68 = local_68 + 1) {
            *(double *)((long)srcs_local + local_68 * 8) =
                 te_00[local_68] + *(double *)((long)srcs_local + local_68 * 8);
          }
          dest_local = dest_local + n * m;
        }
        free(te_00);
      }
    }
  }
  return (double *)srcs_local;
}

Assistant:

double *inform_local_separable_info(int const *srcs, int const *dest,
    size_t l, size_t n, size_t m, int b, size_t k, double *si,
    inform_error *err)
{
    if (l < 1) INFORM_ERROR_RETURN(err, INFORM_ENOSOURCES, NULL);

    bool allocated_si = (si == NULL);

    si = inform_local_active_info(dest, n, m, b, k, si, err);
    if (inform_failed(err))
    {
        if (allocated_si) free(si);
        return NULL;
    }

    const size_t N = n * (m - k);
    double *te = malloc(n * (m - k) * sizeof(double));
    if (te == NULL)
    {
        if (allocated_si) free(si);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }

    for (size_t i = 0; i < l; ++i, srcs += n*m)
    {
        inform_local_transfer_entropy(srcs, dest, NULL, 0, n, m, b, k, te, err);
        if (inform_failed(err))
        {
            free(te);
            if (allocated_si) free(si);
            return NULL;
        }
        for (size_t j = 0; j < N; ++j) si[j] += te[j];
    }

    free(te);

    return si;
}